

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockReturnValueTest_LongIntegerReturnValue_TestShell::createTest
          (TEST_MockReturnValueTest_LongIntegerReturnValue_TestShell *this)

{
  Utest *this_00;
  TEST_MockReturnValueTest_LongIntegerReturnValue_TestShell *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
                                  ,0x1b9);
  TEST_MockReturnValueTest_LongIntegerReturnValue_Test::
  TEST_MockReturnValueTest_LongIntegerReturnValue_Test
            ((TEST_MockReturnValueTest_LongIntegerReturnValue_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockReturnValueTest, LongIntegerReturnValue)
{
    long int expected_value = 7;
    mock().expectOneCall("foo").andReturnValue(expected_value);

    MockActualCall& actual_call = mock().actualCall("foo");
    LONGS_EQUAL(expected_value, actual_call.returnValue().getLongIntValue());
    LONGS_EQUAL(expected_value, actual_call.returnLongIntValue());
    LONGS_EQUAL(expected_value, mock().returnValue().getLongIntValue());
    LONGS_EQUAL(expected_value, mock().longIntReturnValue());
}